

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  ostream *poVar1;
  char *pcVar2;
  undefined1 local_190 [8];
  ostringstream stream;
  TestSpec *spec_local;
  
  stream._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  poVar1 = (ostream *)std::ostream::operator<<((ostringstream *)local_190,*(int *)stream._368_8_);
  pcVar2 = "_counters";
  if (*(int *)stream._368_8_ == 1) {
    pcVar2 = "_counter";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<((ostream *)local_190,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(stream._368_8_ + 8));
  pcVar2 = "_calls";
  if (*(int *)(stream._368_8_ + 8) == 1) {
    pcVar2 = "_call";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<((ostream *)local_190,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(stream._368_8_ + 0x10));
  pcVar2 = "_threads";
  if (*(int *)(stream._368_8_ + 0x10) == 1) {
    pcVar2 = "_thread";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string specToTestName (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream stream;

	stream << spec.atomicCounterCount	<< (spec.atomicCounterCount == 1 ? "_counter" : "_counters");
	stream << "_" << spec.callCount		<< (spec.callCount == 1 ? "_call" : "_calls");
	stream << "_" << spec.threadCount	<< (spec.threadCount == 1 ? "_thread" : "_threads");

	return stream.str();
}